

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O2

size_t Curl_multissl_version(char *buffer,size_t size)

{
  size_t sVar1;
  Curl_ssl *pCVar2;
  Curl_ssl *pCVar3;
  long lVar4;
  size_t sVar5;
  
  pCVar3 = Curl_ssl;
  if (Curl_ssl == &Curl_ssl_multi) {
    pCVar3 = available_backends[0];
  }
  if (pCVar3 != Curl_multissl_version::selected) {
    lVar4 = 0;
    sVar5 = 0;
    pCVar2 = available_backends[0];
    Curl_multissl_version::selected = pCVar3;
    while ((pCVar2 != (Curl_ssl *)0x0 && ((long)sVar5 < 0xc4))) {
      if (lVar4 != 0) {
        Curl_multissl_version::backends[sVar5] = ' ';
        sVar5 = sVar5 + 1;
      }
      if (pCVar3 != pCVar2) {
        Curl_multissl_version::backends[sVar5] = '(';
        sVar5 = sVar5 + 1;
      }
      sVar1 = (*pCVar2->version)(Curl_multissl_version::backends + sVar5,0xc6 - sVar5);
      pCVar3 = Curl_multissl_version::selected;
      sVar5 = sVar1 + sVar5;
      if (Curl_multissl_version::selected != available_backends[lVar4]) {
        Curl_multissl_version::backends[sVar5] = ')';
        sVar5 = sVar5 + 1;
      }
      pCVar2 = available_backends[lVar4 + 1];
      lVar4 = lVar4 + 1;
    }
    Curl_multissl_version::backends[sVar5] = '\0';
    Curl_multissl_version::total = sVar5;
  }
  sVar5 = Curl_multissl_version::total;
  if (Curl_multissl_version::total < size) {
    memcpy(buffer,Curl_multissl_version::backends,Curl_multissl_version::total + 1);
  }
  else {
    memcpy(buffer,Curl_multissl_version::backends,size - 1);
    buffer[size - 1] = '\0';
  }
  if (size - 1 < sVar5) {
    sVar5 = size - 1;
  }
  return sVar5;
}

Assistant:

static size_t Curl_multissl_version(char *buffer, size_t size)
{
  static const struct Curl_ssl *selected;
  static char backends[200];
  static size_t total;
  const struct Curl_ssl *current;

  current = Curl_ssl == &Curl_ssl_multi ? available_backends[0] : Curl_ssl;

  if(current != selected) {
    char *p = backends;
    char *end = backends + sizeof(backends);
    int i;

    selected = current;

    for(i = 0; available_backends[i] && p < (end - 4); i++) {
      if(i)
        *(p++) = ' ';
      if(selected != available_backends[i])
        *(p++) = '(';
      p += available_backends[i]->version(p, end - p - 2);
      if(selected != available_backends[i])
        *(p++) = ')';
    }
    *p = '\0';
    total = p - backends;
  }

  if(size > total)
    memcpy(buffer, backends, total + 1);
  else {
    memcpy(buffer, backends, size - 1);
    buffer[size - 1] = '\0';
  }

  return CURLMIN(size - 1, total);
}